

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SetHasStat(Fts3Table *p)

{
  char *pcVar1;
  sqlite3_stmt *in_RDI;
  sqlite3_stmt sVar2;
  int bHasStat;
  sqlite3_stmt *pStmt;
  char *zSql;
  char *zFmt;
  int rc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  sqlite3_stmt *pStmt_00;
  char *zSql_00;
  undefined4 in_stack_fffffffffffffff0;
  int iVar3;
  
  iVar3 = 0;
  if (in_RDI[0x1bd] == (sqlite3_stmt)0x2) {
    zSql_00 = "SELECT 1 FROM %Q.sqlite_master WHERE tbl_name=\'%q_stat\'";
    pcVar1 = sqlite3_mprintf("SELECT 1 FROM %Q.sqlite_master WHERE tbl_name=\'%q_stat\'",
                             *(undefined8 *)(in_RDI + 0x20),*(undefined8 *)(in_RDI + 0x28));
    if (pcVar1 == (char *)0x0) {
      iVar3 = 7;
    }
    else {
      pStmt_00 = (sqlite3_stmt *)0x0;
      iVar3 = sqlite3_prepare_v2((sqlite3 *)CONCAT44(iVar3,in_stack_fffffffffffffff0),zSql_00,
                                 (int)((ulong)pcVar1 >> 0x20),(sqlite3_stmt **)0x0,
                                 (char **)CONCAT44(in_stack_ffffffffffffffd4,
                                                   in_stack_ffffffffffffffd0));
      if (iVar3 == 0) {
        iVar3 = sqlite3_step(in_RDI);
        sVar2 = (sqlite3_stmt)(iVar3 == 100);
        iVar3 = sqlite3_finalize(pStmt_00);
        if (iVar3 == 0) {
          in_RDI[0x1bd] = sVar2;
        }
      }
      sqlite3_free((void *)0x1cd052);
    }
  }
  return iVar3;
}

Assistant:

static int fts3SetHasStat(Fts3Table *p){
  int rc = SQLITE_OK;
  if( p->bHasStat==2 ){
    const char *zFmt ="SELECT 1 FROM %Q.sqlite_master WHERE tbl_name='%q_stat'";
    char *zSql = sqlite3_mprintf(zFmt, p->zDb, p->zName);
    if( zSql ){
      sqlite3_stmt *pStmt = 0;
      rc = sqlite3_prepare_v2(p->db, zSql, -1, &pStmt, 0);
      if( rc==SQLITE_OK ){
        int bHasStat = (sqlite3_step(pStmt)==SQLITE_ROW);
        rc = sqlite3_finalize(pStmt);
        if( rc==SQLITE_OK ) p->bHasStat = bHasStat;
      }
      sqlite3_free(zSql);
    }else{
      rc = SQLITE_NOMEM;
    }
  }
  return rc;
}